

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::deSerializeFloat
          (cbtQuantizedBvh *this,cbtQuantizedBvhFloatData *quantizedBvhFloatData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  cbtQuantizedBvhNode *ptr;
  cbtQuantizedBvhNodeData *pcVar4;
  cbtBvhSubtreeInfo *ptr_00;
  cbtBvhSubtreeInfoData *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int i;
  uint uVar14;
  long lVar15;
  cbtOptimizedBvhNode *pcVar16;
  cbtOptimizedBvhNodeFloatData *pcVar17;
  cbtQuantizedBvhNode *pcVar18;
  cbtBvhSubtreeInfo *pcVar19;
  long lVar20;
  int *piVar21;
  int i_3;
  ulong uVar22;
  ulong uVar23;
  cbtOptimizedBvhNode *pcVar24;
  int i_4;
  
  lVar15 = 0;
  do {
    (this->m_bvhAabbMax).m_floats[lVar15] = (quantizedBvhFloatData->m_bvhAabbMax).m_floats[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  lVar15 = 0;
  do {
    (this->m_bvhAabbMin).m_floats[lVar15] = (quantizedBvhFloatData->m_bvhAabbMin).m_floats[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  lVar15 = 0;
  do {
    (this->m_bvhQuantization).m_floats[lVar15] =
         (quantizedBvhFloatData->m_bvhQuantization).m_floats[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  this->m_curNodeIndex = quantizedBvhFloatData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhFloatData->m_useQuantization != 0;
  uVar3 = quantizedBvhFloatData->m_numContiguousLeafNodes;
  uVar14 = (this->m_contiguousNodes).m_size;
  if ((int)uVar14 < (int)uVar3) {
    lVar15 = (long)(int)uVar14;
    if ((this->m_contiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar16 = (cbtOptimizedBvhNode *)0x0;
      }
      else {
        pcVar16 = (cbtOptimizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 6,0x10);
        uVar14 = (this->m_contiguousNodes).m_size;
      }
      if (0 < (int)uVar14) {
        lVar20 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar20);
          uVar6 = puVar1[1];
          uVar7 = puVar1[2];
          uVar8 = puVar1[3];
          uVar9 = puVar1[4];
          uVar10 = puVar1[5];
          uVar11 = puVar1[6];
          uVar12 = puVar1[7];
          puVar2 = (undefined8 *)((long)(pcVar16->m_aabbMinOrg).m_floats + lVar20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar2[2] = uVar7;
          puVar2[3] = uVar8;
          puVar2[4] = uVar9;
          puVar2[5] = uVar10;
          puVar2[6] = uVar11;
          puVar2[7] = uVar12;
          lVar20 = lVar20 + 0x40;
        } while ((ulong)uVar14 << 6 != lVar20);
      }
      pcVar24 = (this->m_contiguousNodes).m_data;
      if ((pcVar24 != (cbtOptimizedBvhNode *)0x0) &&
         ((this->m_contiguousNodes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar24);
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pcVar16;
      (this->m_contiguousNodes).m_capacity = uVar3;
    }
    lVar20 = (int)uVar3 - lVar15;
    lVar15 = lVar15 << 6;
    do {
      puVar1 = (undefined8 *)
               ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar15);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      lVar15 = lVar15 + 0x40;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  (this->m_contiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar16 = (this->m_contiguousNodes).m_data;
    pcVar17 = quantizedBvhFloatData->m_contiguousNodesPtr;
    uVar22 = 0;
    pcVar24 = pcVar16;
    do {
      lVar15 = 4;
      do {
        (pcVar24->m_aabbMinOrg).m_floats[lVar15] = (pcVar17->m_aabbMinOrg).m_floats[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      lVar15 = 0;
      do {
        (pcVar24->m_aabbMinOrg).m_floats[lVar15] = (pcVar17->m_aabbMinOrg).m_floats[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      iVar13 = pcVar17->m_subPart;
      uVar23 = uVar22 + 1;
      pcVar24 = pcVar24 + 1;
      pcVar16[uVar22].m_escapeIndex = pcVar17->m_escapeIndex;
      pcVar16[uVar22].m_subPart = iVar13;
      piVar21 = &pcVar17->m_triangleIndex;
      pcVar17 = pcVar17 + 1;
      pcVar16[uVar22].m_triangleIndex = *piVar21;
      uVar22 = uVar23;
    } while (uVar23 != uVar3);
  }
  uVar3 = quantizedBvhFloatData->m_numQuantizedContiguousNodes;
  uVar14 = (this->m_quantizedContiguousNodes).m_size;
  if ((int)uVar14 < (int)uVar3) {
    lVar15 = (long)(int)uVar14;
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar18 = (cbtQuantizedBvhNode *)0x0;
      }
      else {
        pcVar18 = (cbtQuantizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 4,0x10);
        uVar14 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar14) {
        lVar20 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar20);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar18->m_quantizedAabbMin + lVar20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar20 = lVar20 + 0x10;
        } while ((ulong)uVar14 << 4 != lVar20);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr != (cbtQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pcVar18;
      (this->m_quantizedContiguousNodes).m_capacity = uVar3;
    }
    lVar20 = (int)uVar3 - lVar15;
    lVar15 = lVar15 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar15);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar15 = lVar15 + 0x10;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar4 = quantizedBvhFloatData->m_quantizedContiguousNodesPtr;
    pcVar18 = (this->m_quantizedContiguousNodes).m_data;
    lVar15 = 0;
    do {
      *(undefined4 *)((long)pcVar18->m_quantizedAabbMax + lVar15 + 6) =
           *(undefined4 *)((long)pcVar4->m_quantizedAabbMax + lVar15 + 6);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMax + lVar15) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar15);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMax + lVar15 + 2) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar15 + 2);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMax + lVar15 + 4) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMax + lVar15 + 4);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMin + lVar15) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar15);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMin + lVar15 + 2) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar15 + 2);
      *(undefined2 *)((long)pcVar18->m_quantizedAabbMin + lVar15 + 4) =
           *(undefined2 *)((long)pcVar4->m_quantizedAabbMin + lVar15 + 4);
      lVar15 = lVar15 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar15);
  }
  this->m_traversalMode = quantizedBvhFloatData->m_traversalMode;
  uVar3 = quantizedBvhFloatData->m_numSubtreeHeaders;
  uVar14 = (this->m_SubtreeHeaders).m_size;
  if (((int)uVar14 < (int)uVar3) && ((this->m_SubtreeHeaders).m_capacity < (int)uVar3)) {
    if (uVar3 == 0) {
      pcVar19 = (cbtBvhSubtreeInfo *)0x0;
    }
    else {
      pcVar19 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal((long)(int)uVar3 << 5,0x10);
      uVar14 = (this->m_SubtreeHeaders).m_size;
    }
    if (0 < (int)uVar14) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar15);
        uVar6 = puVar1[1];
        uVar7 = puVar1[2];
        uVar8 = puVar1[3];
        puVar2 = (undefined8 *)((long)pcVar19->m_quantizedAabbMin + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        puVar2[2] = uVar7;
        puVar2[3] = uVar8;
        lVar15 = lVar15 + 0x20;
      } while ((ulong)uVar14 << 5 != lVar15);
    }
    ptr_00 = (this->m_SubtreeHeaders).m_data;
    if ((ptr_00 != (cbtBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr_00);
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pcVar19;
    (this->m_SubtreeHeaders).m_capacity = uVar3;
  }
  (this->m_SubtreeHeaders).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar5 = quantizedBvhFloatData->m_subTreeInfoPtr;
    lVar15 = 0;
    piVar21 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    do {
      *(unsigned_short *)((long)piVar21 + -6) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar15);
      *(unsigned_short *)(piVar21 + -1) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar15 + 2);
      *(unsigned_short *)((long)piVar21 + -2) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMax + lVar15 + 4);
      ((cbtBvhSubtreeInfo *)(piVar21 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar15);
      *(unsigned_short *)((long)piVar21 + -10) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar15 + 2);
      *(unsigned_short *)(piVar21 + -2) =
           *(unsigned_short *)((long)pcVar5->m_quantizedAabbMin + lVar15 + 4);
      lVar20 = lVar15 + -8;
      lVar15 = lVar15 + 0x14;
      *(undefined8 *)piVar21 = *(undefined8 *)((long)pcVar5->m_quantizedAabbMin + lVar20);
      piVar21 = piVar21 + 8;
    } while ((ulong)uVar3 * 0x14 != lVar15);
  }
  return;
}

Assistant:

void cbtQuantizedBvh::deSerializeFloat(struct cbtQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization != 0;

	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = cbtTraversalMode(quantizedBvhFloatData.m_traversalMode);

	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			cbtBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}